

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O3

DFsSection * __thiscall DFsScript::FindSectionEnd(DFsScript *this,char *brace)

{
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 *paVar2;
  long lVar3;
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar4;
  
  lVar3 = 0;
  do {
    aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)this->sections[lVar3].field_0.p;
    if (aVar1.p != (DFsSection *)0x0) {
      if ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) == 0) {
        do {
          aVar4 = aVar1;
          if (this->data + (aVar4.p)->end_index == brace) {
            return aVar4.p;
          }
          aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)((aVar4.p)->next).field_0.p;
          if (aVar1.p == (DFsSection *)0x0) goto LAB_006b0f2a;
        } while ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) == 0);
        paVar2 = &((aVar4.p)->next).field_0;
      }
      else {
        paVar2 = &this->sections[lVar3].field_0;
      }
      *paVar2 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)0x0;
    }
LAB_006b0f2a:
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x11) {
      return (DFsSection *)0x0;
    }
  } while( true );
}

Assistant:

DFsSection *DFsScript::FindSectionEnd(const char *brace)
{
	int n;
	
	// hash table is no use, they are hashed according to
	// the offset of the starting brace
	
	// we have to go through every entry to find from the
	// ending brace
	
	for(n=0; n<SECTIONSLOTS; n++)      // check all sections in all chains
	{
		DFsSection *current = sections[n];
		
		while(current)
		{
			if(SectionEnd(current) == brace) return current;        // found it
			current = current->next;
		}
	}
	return NULL;    // not found
}